

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O3

enable_if_t<std::is_integral<unsigned_int>::value,_bool>
math::wide_integer::operator==(uintwide_t<24U,_unsigned_char,_void,_false> *u,uint *v)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  value_type_conflict4 *__s;
  value_type_conflict4 avStack_d [5];
  
  uVar3 = *v;
  avStack_d[3] = 0;
  avStack_d[1] = '\0';
  avStack_d[2] = '\0';
  lVar2 = 0;
  if (uVar3 == 0) {
    __s = avStack_d + 1;
  }
  else {
    do {
      lVar1 = lVar2;
      avStack_d[lVar1 + 1] = (value_type_conflict4)uVar3;
      lVar2 = lVar1 + 1;
      if (uVar3 < 0x100) break;
      uVar3 = uVar3 >> 8;
    } while (lVar1 != 2);
    if (lVar1 == 2) goto LAB_0013efcd;
    __s = avStack_d + lVar1 + 2;
  }
  memset(__s,0,3 - lVar2);
LAB_0013efcd:
  lVar2 = 2;
  do {
    lVar1 = lVar2;
    if (lVar1 == -1) break;
    lVar2 = lVar1 + -1;
  } while ((u->values).super_array<unsigned_char,_3UL>.elems[lVar1] == avStack_d[lVar1 + 1]);
  return lVar1 == -1;
}

Assistant:

constexpr auto operator==(const uintwide_t<Width2, LimbType, AllocatorType, IsSigned>& u, const IntegralType& v) -> std::enable_if_t<std::is_integral<IntegralType>::value, bool> { return u.operator==(uintwide_t<Width2, LimbType, AllocatorType, IsSigned>(v)); }